

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

void __thiscall MemoryManager::~MemoryManager(MemoryManager *this)

{
  void *pvVar1;
  long *in_RDI;
  uint16_t j;
  uint8_t ***i;
  uint8_t ***__end1;
  uint8_t ***__begin1;
  uint8_t **(*__range1) [1024];
  ushort local_2a;
  long *local_18;
  
  for (local_18 = in_RDI; local_18 != in_RDI + 0x400; local_18 = local_18 + 1) {
    if (*local_18 != 0) {
      for (local_2a = 0; local_2a < 0x400; local_2a = local_2a + 1) {
        if ((*(long *)(*local_18 + (ulong)local_2a * 8) != 0) &&
           (pvVar1 = *(void **)(*local_18 + (ulong)local_2a * 8), pvVar1 != (void *)0x0)) {
          operator_delete__(pvVar1);
        }
        *(undefined8 *)(*local_18 + (ulong)local_2a * 8) = 0;
      }
      if ((void *)*local_18 != (void *)0x0) {
        operator_delete__((void *)*local_18);
      }
      *local_18 = 0;
    }
  }
  return;
}

Assistant:

MemoryManager::~MemoryManager(){
    for(auto & i : this->memory){
        if(i){
            for(uint16_t j = 0; j < 1024; j++){
                if(i[j])
                    delete[] i[j];
                i[j] = nullptr;
            }
            delete[] i;
            i = nullptr;
        }
    }
}